

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O2

bool FindEitherActiveRuntimeFilename
               (char *prefix_desc,string *rt_dir_prefix,uint16_t major_version,string *out)

{
  bool bVar1;
  undefined6 in_register_00000012;
  allocator local_1f9;
  string local_1f8;
  string local_1d8;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_1b8;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  std::operator<<((ostream *)&oss,
                  "Looking for active_runtime.x86_64.json or active_runtime.json in ");
  std::operator<<((ostream *)&oss,prefix_desc);
  std::operator<<((ostream *)&oss,": ");
  std::operator<<((ostream *)&oss,(string *)rt_dir_prefix);
  std::__cxx11::string::string((string *)&local_1f8,"",&local_1f9);
  std::__cxx11::stringbuf::str();
  local_1b8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LoaderLogger::LogInfoMessage(&local_1f8,&local_1d8,&local_1b8);
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  std::__cxx11::to_string(&local_1d8,1);
  std::operator+(&local_1f8,rt_dir_prefix,&local_1d8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                 &local_1f8,"/active_runtime.x86_64.json");
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  bVar1 = FileSysUtilsPathExists((string *)&oss);
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)CONCAT62(in_register_00000012,major_version));
    std::__cxx11::string::~string((string *)&oss);
    bVar1 = true;
  }
  else {
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::to_string(&local_1d8,1);
    std::operator+(&local_1f8,rt_dir_prefix,&local_1d8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                   &local_1f8,"/active_runtime.json");
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1d8);
    bVar1 = FileSysUtilsPathExists((string *)&oss);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)CONCAT62(in_register_00000012,major_version));
    }
    std::__cxx11::string::~string((string *)&oss);
  }
  return bVar1;
}

Assistant:

static bool FindEitherActiveRuntimeFilename(const char *prefix_desc, const std::string &rt_dir_prefix, uint16_t major_version,
                                            std::string &out) {
    {
        std::ostringstream oss;
        oss << "Looking for active_runtime." XR_ARCH_ABI ".json or active_runtime.json in ";
        oss << prefix_desc;
        oss << ": ";
        oss << rt_dir_prefix;

        LoaderLogger::LogInfoMessage("", oss.str());
    }
    {
        auto decorated_path = rt_dir_prefix + std::to_string(major_version) + "/active_runtime." XR_ARCH_ABI ".json";

        if (FileSysUtilsPathExists(decorated_path)) {
            out = decorated_path;
            return true;
        }
    }
    {
        auto undecorated_path = rt_dir_prefix + std::to_string(major_version) + "/active_runtime.json";

        if (FileSysUtilsPathExists(undecorated_path)) {
            out = undecorated_path;
            return true;
        }
    }
    return false;
}